

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts5HashScanInit(Fts5Hash *p,char *pTerm,int nTerm)

{
  int iVar1;
  undefined8 *__s;
  Fts5HashEntry *pLeft;
  Fts5HashEntry *pFVar2;
  long lVar3;
  undefined8 *puVar4;
  
  p->pScan = (Fts5HashEntry *)0x0;
  __s = (undefined8 *)sqlite3_malloc64(0x100);
  if (__s == (undefined8 *)0x0) {
    iVar1 = 7;
  }
  else {
    memset(__s,0,0x100);
    for (lVar3 = 0; lVar3 < p->nSlot; lVar3 = lVar3 + 1) {
      pFVar2 = (Fts5HashEntry *)(p->aSlot + lVar3);
LAB_001c9d98:
      pFVar2 = pFVar2->pHashNext;
      if (pFVar2 != (Fts5HashEntry *)0x0) {
        if (pTerm != (char *)0x0) goto code_r0x001c9da5;
        goto LAB_001c9dbf;
      }
    }
    pFVar2 = (Fts5HashEntry *)0x0;
    for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
      pFVar2 = fts5HashEntryMerge(pFVar2,(Fts5HashEntry *)__s[lVar3]);
    }
    sqlite3_free(__s);
    p->pScan = pFVar2;
    iVar1 = 0;
  }
  return iVar1;
code_r0x001c9da5:
  if (nTerm <= pFVar2->nKey) {
    iVar1 = bcmp(pFVar2 + 1,pTerm,(long)nTerm);
    if (iVar1 == 0) {
LAB_001c9dbf:
      pFVar2->pScanNext = (Fts5HashEntry *)0x0;
      pLeft = pFVar2;
      for (puVar4 = __s; (Fts5HashEntry *)*puVar4 != (Fts5HashEntry *)0x0; puVar4 = puVar4 + 1) {
        pLeft = fts5HashEntryMerge(pLeft,(Fts5HashEntry *)*puVar4);
        *puVar4 = 0;
      }
      *puVar4 = pLeft;
    }
  }
  goto LAB_001c9d98;
}

Assistant:

static int sqlite3Fts5HashScanInit(
  Fts5Hash *p,                    /* Hash table to query */
  const char *pTerm, int nTerm    /* Query prefix */
){
  return fts5HashEntrySort(p, pTerm, nTerm, &p->pScan);
}